

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

short __thiscall QByteArray::toShort(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  bool bVar1;
  short sVar2;
  int in_ECX;
  long lVar3;
  undefined4 in_register_00000014;
  bool bVar4;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar5;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  if (this_00 == (QLocaleData *)0x0) {
    bVar1 = true;
    lVar3 = 0;
  }
  else {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar5 = QLocaleData::bytearrayToLongLong(this_00,num,in_ECX);
    bVar1 = QVar5.used < 1;
    lVar3 = 0;
    if (0 < QVar5.used) {
      lVar3 = QVar5.result;
    }
  }
  bVar4 = (short)lVar3 != lVar3;
  if (ok != (bool *)0x0) {
    *ok = (bool)((bVar4 | bVar1) ^ 1);
  }
  sVar2 = 0;
  if (!(bool)(bVar4 | bVar1)) {
    sVar2 = (short)lVar3;
  }
  return sVar2;
}

Assistant:

short QByteArray::toShort(bool *ok, int base) const
{
    return QtPrivate::toIntegral<short>(qToByteArrayViewIgnoringNull(*this), ok, base);
}